

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_path_or_unary_expression(xpath_parser *this)

{
  lexeme_t lVar1;
  nodetest_t nVar2;
  xpath_value_type xVar3;
  xpath_ast_node *pxVar4;
  xpath_parser *in_RDI;
  xpath_parser *unaff_retaddr;
  xpath_ast_node *n_1;
  lexeme_t l;
  xpath_ast_node *n;
  char_t *state;
  xpath_parser *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  xpath_ast_node *in_stack_ffffffffffffffe0;
  xpath_parser *in_stack_ffffffffffffffe8;
  xpath_parser *this_00;
  xpath_parser *in_stack_fffffffffffffff8;
  
  this_00 = in_RDI;
  lVar1 = xpath_lexer::current(&in_RDI->_lexer);
  if ((((lVar1 != lex_var_ref) &&
       (lVar1 = xpath_lexer::current(&in_RDI->_lexer), lVar1 != lex_open_brace)) &&
      (lVar1 = xpath_lexer::current(&in_RDI->_lexer), lVar1 != lex_quoted_string)) &&
     ((lVar1 = xpath_lexer::current(&in_RDI->_lexer), lVar1 != lex_number &&
      (lVar1 = xpath_lexer::current(&in_RDI->_lexer), lVar1 != lex_string)))) {
    lVar1 = xpath_lexer::current(&in_RDI->_lexer);
    if (lVar1 != lex_minus) {
      pxVar4 = parse_location_path(in_stack_ffffffffffffffe8);
      return pxVar4;
    }
    xpath_lexer::next(&in_RDI->_lexer);
    pxVar4 = parse_expression(in_stack_ffffffffffffffe8,
                              (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    if (pxVar4 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar4 = alloc_node(this_00,(ast_type_t)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                        (xpath_value_type)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                        (xpath_ast_node *)
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    return pxVar4;
  }
  lVar1 = xpath_lexer::current(&in_RDI->_lexer);
  if (lVar1 == lex_string) {
    in_stack_ffffffffffffffe8 = (xpath_parser *)xpath_lexer::state(&in_RDI->_lexer);
    while (((anonymous_namespace)::chartype_table[*(byte *)&in_stack_ffffffffffffffe8->_alloc] & 8)
           != 0) {
      in_stack_ffffffffffffffe8 = (xpath_parser *)((long)&in_stack_ffffffffffffffe8->_alloc + 1);
    }
    if (*(char *)&in_stack_ffffffffffffffe8->_alloc != '(') {
      pxVar4 = parse_location_path(in_stack_ffffffffffffffe8);
      return pxVar4;
    }
    xpath_lexer::contents(&in_RDI->_lexer);
    nVar2 = parse_node_test_type
                      ((xpath_parser *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                       ,(xpath_lexer_string *)in_stack_ffffffffffffffd0);
    if (nVar2 != nodetest_none) {
      pxVar4 = parse_location_path(in_stack_ffffffffffffffe8);
      return pxVar4;
    }
  }
  pxVar4 = parse_filter_expression(in_stack_ffffffffffffffe8);
  if (pxVar4 == (xpath_ast_node *)0x0) {
    pxVar4 = (xpath_ast_node *)0x0;
  }
  else {
    lVar1 = xpath_lexer::current(&in_RDI->_lexer);
    if ((lVar1 == lex_slash) ||
       (lVar1 = xpath_lexer::current(&in_RDI->_lexer), lVar1 == lex_double_slash)) {
      lVar1 = xpath_lexer::current(&in_RDI->_lexer);
      xpath_lexer::next(&in_RDI->_lexer);
      if (lVar1 == lex_double_slash) {
        xVar3 = xpath_ast_node::rettype(pxVar4);
        if (xVar3 != xpath_type_node_set) {
          pxVar4 = error(in_stack_ffffffffffffffd0,(char *)in_RDI);
          return pxVar4;
        }
        pxVar4 = alloc_node(unaff_retaddr,(ast_type_t)((ulong)in_stack_fffffffffffffff8 >> 0x20),
                            (xpath_ast_node *)this_00,
                            (axis_t)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                            (nodetest_t)in_stack_ffffffffffffffe8,&pxVar4->_type);
        if (pxVar4 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
      }
      pxVar4 = parse_relative_location_path(in_stack_fffffffffffffff8,(xpath_ast_node *)this_00);
    }
  }
  return pxVar4;
}

Assistant:

xpath_ast_node* parse_path_or_unary_expression()
		{
			// Clarification.
			// PathExpr begins with either LocationPath or FilterExpr.
			// FilterExpr begins with PrimaryExpr
			// PrimaryExpr begins with '$' in case of it being a variable reference,
			// '(' in case of it being an expression, string literal, number constant or
			// function call.
			if (_lexer.current() == lex_var_ref || _lexer.current() == lex_open_brace ||
				_lexer.current() == lex_quoted_string || _lexer.current() == lex_number ||
				_lexer.current() == lex_string)
			{
				if (_lexer.current() == lex_string)
				{
					// This is either a function call, or not - if not, we shall proceed with location path
					const char_t* state = _lexer.state();

					while (PUGI_IMPL_IS_CHARTYPE(*state, ct_space)) ++state;

					if (*state != '(')
						return parse_location_path();

					// This looks like a function call; however this still can be a node-test. Check it.
					if (parse_node_test_type(_lexer.contents()) != nodetest_none)
						return parse_location_path();
				}

				xpath_ast_node* n = parse_filter_expression();
				if (!n) return NULL;

				if (_lexer.current() == lex_slash || _lexer.current() == lex_double_slash)
				{
					lexeme_t l = _lexer.current();
					_lexer.next();

					if (l == lex_double_slash)
					{
						if (n->rettype() != xpath_type_node_set)
							return error("Step has to be applied to node set");

						n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, NULL);
						if (!n) return NULL;
					}

					// select from location path
					return parse_relative_location_path(n);
				}

				return n;
			}
			else if (_lexer.current() == lex_minus)
			{
				_lexer.next();

				// precedence 7+ - only parses union expressions
				xpath_ast_node* n = parse_expression(7);
				if (!n) return NULL;

				return alloc_node(ast_op_negate, xpath_type_number, n);
			}
			else
			{
				return parse_location_path();
			}
		}